

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureFormatTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Performance::TextureFormatTests::init(TextureFormatTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 format;
  deUint32 value;
  Context *context;
  Texture2DRenderCase *node;
  _Alloc_hider description;
  _Alloc_hider name;
  char *pcVar1;
  allocator<char> local_d5;
  deUint32 local_d4;
  Texture2DRenderCase *local_d0;
  TestNode *local_c8;
  long local_c0;
  string descriptionBase;
  string nameBase;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  
  local_c8 = (TestNode *)this;
  for (local_c0 = 0; local_c0 != 0x80; local_c0 = local_c0 + 0x10) {
    format = *(deUint32 *)((long)&init::texFormats[0].format + local_c0);
    value = *(deUint32 *)((long)&init::texFormats[0].dataType + local_c0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nameBase,*(char **)((long)&init::texFormats[0].name + local_c0),
               (allocator<char> *)&local_58);
    pcVar1 = glu::getTextureFormatName(format);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pcVar1,&local_d5);
    std::operator+(&local_58,&local_78,", ");
    pcVar1 = glu::getTypeName(value);
    std::operator+(&descriptionBase,&local_58,pcVar1);
    local_d4 = value;
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    local_d0 = (Texture2DRenderCase *)operator_new(0x220);
    name = nameBase._M_dataplus;
    description = descriptionBase._M_dataplus;
    context = (Context *)local_c8[1]._vptr_TestNode;
    tcu::Matrix<float,_3,_3>::Matrix((Matrix<float,_3,_3> *)&local_58);
    node = local_d0;
    Texture2DRenderCase::Texture2DRenderCase
              (local_d0,context,name._M_p,description._M_p,format,local_d4,0x812f,0x812f,0x2600,
               0x2600,(Mat3 *)&local_58,1,false);
    tcu::TestNode::addChild(local_c8,(TestNode *)node);
    std::__cxx11::string::~string((string *)&descriptionBase);
    std::__cxx11::string::~string((string *)&nameBase);
  }
  return 0x80;
}

Assistant:

void TextureFormatTests::init (void)
{
	static const struct
	{
		const char*	name;
		deUint32	format;
		deUint32	dataType;
	} texFormats[] =
	{
		{ "a8",			GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "l8",			GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "la88",		GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb565",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba5551",	GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
	{
		deUint32	format			= texFormats[formatNdx].format;
		deUint32	dataType		= texFormats[formatNdx].dataType;
		string		nameBase		= texFormats[formatNdx].name;
		deUint32	wrapS			= GL_CLAMP_TO_EDGE;
		deUint32	wrapT			= GL_CLAMP_TO_EDGE;
		deUint32	minFilter		= GL_NEAREST;
		deUint32	magFilter		= GL_NEAREST;
		int			numTextures		= 1;
		string		descriptionBase	= string(glu::getTextureFormatName(format)) + ", " + glu::getTypeName(dataType);

		addChild(new Texture2DRenderCase(m_context, nameBase.c_str(), descriptionBase.c_str(), format, dataType, wrapS, wrapT, minFilter, magFilter, tcu::Mat3(), numTextures, false /* npot */));
	}
}